

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.hpp
# Opt level: O3

void __thiscall helics::MessageTimeOperator::~MessageTimeOperator(MessageTimeOperator *this)

{
  _Manager_type p_Var1;
  
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageTimeOperator_004c0c98;
  p_Var1 = (this->TimeFunction).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->TimeFunction,(_Any_data *)&this->TimeFunction,__destroy_functor);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

class HELICS_CXX_EXPORT MessageTimeOperator: public FilterOperator {
  public:
    /** default constructor*/
    MessageTimeOperator() = default;
    /** set the function to modify the time of the message in the constructor*/
    explicit MessageTimeOperator(std::function<Time(Time)> userTimeFunction);
    /** set the function to modify the time of the message*/
    void setTimeFunction(std::function<Time(Time)> userTimeFunction);

  private:
    std::function<Time(Time)> TimeFunction;  //!< the function that actually does the processing
    virtual std::unique_ptr<Message> process(std::unique_ptr<Message> message) override;
}